

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryAnimationClipsLoader14.cpp
# Opt level: O2

void __thiscall
COLLADASaxFWL::LibraryAnimationClipsLoader14::begin__instance_animation
          (LibraryAnimationClipsLoader14 *this)

{
  instance_animation__AttributeData *in_RSI;
  
  begin__instance_animation
            ((LibraryAnimationClipsLoader14 *)
             &this[-1].super_IParserImpl14.super_ColladaParserAutoGen14,in_RSI);
  return;
}

Assistant:

bool LibraryAnimationClipsLoader14::begin__instance_animation( const COLLADASaxFWL14::instance_animation__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__instance_animation(attributeData));
COLLADASaxFWL::instance_animation__AttributeData attrData;
attrData.sid = attributeData.sid;
attrData.name = attributeData.name;
if ( (attributeData.present_attributes & COLLADASaxFWL14::instance_animation__AttributeData::ATTRIBUTE_URL_PRESENT) == COLLADASaxFWL14::instance_animation__AttributeData::ATTRIBUTE_URL_PRESENT ) {
    attrData.url = attributeData.url;
    attrData.present_attributes |= COLLADASaxFWL::instance_animation__AttributeData::ATTRIBUTE_URL_PRESENT;
}
return mLoader->begin__instance_animation(attrData);
}